

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void add_entities(ecs_world_t *world,ecs_entity_t entity,ecs_entities_t *components)

{
  _Bool _Var1;
  ecs_stage_t *stage;
  ecs_table_t *dst_table;
  ecs_entities_t added;
  ecs_entity_info_t info;
  ecs_entity_t buffer [32];
  ecs_world_t *local_160;
  ecs_entities_t local_158;
  ecs_entity_info_t local_148;
  ecs_entity_t local_128 [32];
  
  local_160 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x5a7);
  if (local_160 == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x5a7,"void add_entities(ecs_world_t *, ecs_entity_t, ecs_entities_t *)");
  }
  _ecs_assert(components->count < 0x20,2,(char *)0x0,"components->count < ECS_MAX_ADD_REMOVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x5a8);
  if (components->count < 0x20) {
    stage = ecs_get_stage(&local_160);
    _Var1 = ecs_defer_add(local_160,stage,entity,components);
    if (!_Var1) {
      ecs_get_info(local_160,entity,&local_148);
      local_158.array = local_128;
      local_158.count = 0;
      dst_table = ecs_table_traverse_add(local_160,local_148.table,components,&local_158);
      commit(local_160,entity,&local_148,dst_table,&local_158,(ecs_entities_t *)0x0);
      ecs_defer_flush(local_160,stage);
    }
    return;
  }
  __assert_fail("components->count < (32)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x5a8,"void add_entities(ecs_world_t *, ecs_entity_t, ecs_entities_t *)");
}

Assistant:

static
void add_entities(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entities_t * components)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(components->count < ECS_MAX_ADD_REMOVE, ECS_INVALID_PARAMETER, NULL);
    ecs_stage_t *stage = ecs_get_stage(&world);

    if (ecs_defer_add(world, stage, entity, components)) {
        return;
    }

    ecs_entity_info_t info;
    ecs_get_info(world, entity, &info);

    ecs_entity_t buffer[ECS_MAX_ADD_REMOVE];
    ecs_entities_t added = { .array = buffer };

    ecs_table_t *src_table = info.table;
    ecs_table_t *dst_table = ecs_table_traverse_add(
        world, src_table, components, &added);

    commit(world, entity, &info, dst_table, &added, NULL);

    ecs_defer_flush(world, stage);
}